

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
          (KNearestNeighborsClassifier *this)

{
  undefined8 *puVar1;
  
  if ((this->_oneof_case_[1] == 0x6e) &&
     (puVar1 = (undefined8 *)(this->DefaultClassLabel_).defaultint64label_,
     puVar1 != &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    if (puVar1 != (undefined8 *)0x0) {
      if ((long *)*puVar1 != puVar1 + 2) {
        operator_delete((long *)*puVar1,puVar1[2] + 1);
      }
    }
    operator_delete(puVar1,0x20);
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void KNearestNeighborsClassifier::clear_DefaultClassLabel() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.KNearestNeighborsClassifier)
  switch (DefaultClassLabel_case()) {
    case kDefaultStringLabel: {
      DefaultClassLabel_.defaultstringlabel_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
      break;
    }
    case kDefaultInt64Label: {
      // No need to clear
      break;
    }
    case DEFAULTCLASSLABEL_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = DEFAULTCLASSLABEL_NOT_SET;
}